

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zmtp_engine.cpp
# Opt level: O2

void __thiscall zmq::zmtp_engine_t::plug_internal(zmtp_engine_t *this)

{
  size_t sVar1;
  
  stream_engine_base_t::set_handshake_timer(&this->super_stream_engine_base_t);
  (this->super_stream_engine_base_t)._outpos = this->_greeting_send;
  sVar1 = (this->super_stream_engine_base_t)._outsize;
  (this->super_stream_engine_base_t)._outsize = sVar1 + 1;
  this->_greeting_send[sVar1] = 0xff;
  put_uint64((this->super_stream_engine_base_t)._outpos +
             (this->super_stream_engine_base_t)._outsize,
             (ulong)(this->super_stream_engine_base_t)._options.routing_id_size + 1);
  sVar1 = (this->super_stream_engine_base_t)._outsize;
  (this->super_stream_engine_base_t)._outsize = sVar1 + 9;
  (this->super_stream_engine_base_t)._outpos[sVar1 + 8] = '\x7f';
  stream_engine_base_t::set_pollin(&this->super_stream_engine_base_t);
  stream_engine_base_t::set_pollout(&this->super_stream_engine_base_t);
  stream_engine_base_t::in_event(&this->super_stream_engine_base_t);
  return;
}

Assistant:

void zmq::zmtp_engine_t::plug_internal ()
{
    // start optional timer, to prevent handshake hanging on no input
    set_handshake_timer ();

    //  Send the 'length' and 'flags' fields of the routing id message.
    //  The 'length' field is encoded in the long format.
    _outpos = _greeting_send;
    _outpos[_outsize++] = UCHAR_MAX;
    put_uint64 (&_outpos[_outsize], _options.routing_id_size + 1);
    _outsize += 8;
    _outpos[_outsize++] = 0x7f;

    set_pollin ();
    set_pollout ();
    //  Flush all the data that may have been already received downstream.
    in_event ();
}